

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

void __thiscall CCharmapToUniMB::~CCharmapToUniMB(CCharmapToUniMB *this)

{
  void *in_RDI;
  CCharmapToUniMB *unaff_retaddr;
  
  ~CCharmapToUniMB(unaff_retaddr);
  operator_delete(in_RDI,0x1210);
  return;
}

Assistant:

CCharmapToUniMB::~CCharmapToUniMB()
{
    int i;
    cmap_mb_entry *p;

    /* delete all of our sub-tables */
    for (i = 0, p = map_ ; i < 256 ; ++i, ++p)
    {
        /* if this sub-table was allocated, delete it */
        if (p->sub != 0)
            t3free(p->sub);
    }
}